

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O0

void emit_sos(j_compress_ptr cinfo)

{
  long in_RDI;
  jpeg_component_info *compptr;
  int ta;
  int td;
  int i;
  JPEG_MARKER in_stack_ffffffffffffffdc;
  j_compress_ptr in_stack_ffffffffffffffe0;
  int local_c;
  
  emit_marker(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  emit_2bytes(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  emit_byte(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x144); local_c = local_c + 1) {
    in_stack_ffffffffffffffe0 = *(j_compress_ptr *)(in_RDI + 0x148 + (long)local_c * 8);
    emit_byte(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    if ((*(int *)(in_RDI + 0x19c) == 0) && (*(int *)(in_RDI + 0x1a4) == 0)) {
      in_stack_ffffffffffffffdc = *(JPEG_MARKER *)((long)&in_stack_ffffffffffffffe0->progress + 4);
    }
    else {
      in_stack_ffffffffffffffdc = 0;
    }
    emit_byte(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  }
  emit_byte(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  emit_byte(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  emit_byte(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  return;
}

Assistant:

LOCAL(void)
emit_sos(j_compress_ptr cinfo)
/* Emit a SOS marker */
{
  int i, td, ta;
  jpeg_component_info *compptr;

  emit_marker(cinfo, M_SOS);

  emit_2bytes(cinfo, 2 * cinfo->comps_in_scan + 2 + 1 + 3); /* length */

  emit_byte(cinfo, cinfo->comps_in_scan);

  for (i = 0; i < cinfo->comps_in_scan; i++) {
    compptr = cinfo->cur_comp_info[i];
    emit_byte(cinfo, compptr->component_id);

    /* We emit 0 for unused field(s); this is recommended by the P&M text
     * but does not seem to be specified in the standard.
     */

    /* DC needs no table for refinement scan */
    td = cinfo->Ss == 0 && cinfo->Ah == 0 ? compptr->dc_tbl_no : 0;
    /* AC needs no table when not present */
    ta = cinfo->Se ? compptr->ac_tbl_no : 0;

    emit_byte(cinfo, (td << 4) + ta);
  }

  emit_byte(cinfo, cinfo->Ss);
  emit_byte(cinfo, cinfo->Se);
  emit_byte(cinfo, (cinfo->Ah << 4) + cinfo->Al);
}